

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::function::init_call_ptr(function *this)

{
  bool bVar1;
  code *pcVar2;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  if ((*(byte *)(in_RDI + 0x41) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x42) & 1) == 0) {
      *(code **)(in_RDI + 0xb0) = call_rr;
    }
    else {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(unaff_retaddr);
      pcVar2 = call_rl;
      if (bVar1) {
        pcVar2 = call_el;
      }
      *(code **)(in_RDI + 0xb0) = pcVar2;
    }
  }
  else {
    *(code **)(in_RDI + 0xb0) = call_vv;
  }
  return;
}

Assistant:

inline void init_call_ptr() noexcept
		{
			if (!mIsVargs) {
				if (mIsLambda)
					call_ptr = mArgs.empty() ? &call_el : &call_rl;
				else
					call_ptr = &call_rr;
			}
			else
				call_ptr = &call_vv;
		}